

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

ExceptionOr<kj::_::Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Own<capnp::PipelineHook>_>_>
* __thiscall
kj::_::
ExceptionOr<kj::_::Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Own<capnp::PipelineHook>_>_>
::operator=(ExceptionOr<kj::_::Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Own<capnp::PipelineHook>_>_>
            *this,ExceptionOr<kj::_::Tuple<kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>,_kj::Own<capnp::PipelineHook>_>_>
                  *param_1)

{
  PipelineHook *pPVar1;
  Disposer *pDVar2;
  PromiseNode *pPVar3;
  
  ExceptionOrValue::operator=(&this->super_ExceptionOrValue,&param_1->super_ExceptionOrValue);
  if (param_1 != this) {
    if ((this->value).ptr.isSet == true) {
      (this->value).ptr.isSet = false;
      pPVar1 = (this->value).ptr.field_1.value.impl.
               super_TupleElement<1U,_kj::Own<capnp::PipelineHook>_>.value.ptr;
      if (pPVar1 != (PipelineHook *)0x0) {
        (this->value).ptr.field_1.value.impl.super_TupleElement<1U,_kj::Own<capnp::PipelineHook>_>.
        value.ptr = (PipelineHook *)0x0;
        pDVar2 = (this->value).ptr.field_1.value.impl.
                 super_TupleElement<1U,_kj::Own<capnp::PipelineHook>_>.value.disposer;
        (**pDVar2->_vptr_Disposer)
                  (pDVar2,(_func_int *)
                          ((long)&pPVar1->_vptr_PipelineHook + (long)pPVar1->_vptr_PipelineHook[-2])
                  );
      }
      pPVar3 = (this->value).ptr.field_1.value.impl.
               super_TupleElement<0U,_kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>_>
               .value.super_PromiseBase.node.ptr;
      if (pPVar3 != (PromiseNode *)0x0) {
        (this->value).ptr.field_1.value.impl.
        super_TupleElement<0U,_kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>_>
        .value.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
        pDVar2 = (this->value).ptr.field_1.value.impl.
                 super_TupleElement<0U,_kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>_>
                 .value.super_PromiseBase.node.disposer;
        (**pDVar2->_vptr_Disposer)
                  (pDVar2,(_func_int *)
                          ((long)&pPVar3->_vptr_PromiseNode + (long)pPVar3->_vptr_PromiseNode[-2]));
      }
    }
    if ((param_1->value).ptr.isSet == true) {
      pPVar3 = (param_1->value).ptr.field_1.value.impl.
               super_TupleElement<0U,_kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>_>
               .value.super_PromiseBase.node.ptr;
      (this->value).ptr.field_1.value.impl.
      super_TupleElement<0U,_kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>_>
      .value.super_PromiseBase.node.disposer =
           (param_1->value).ptr.field_1.value.impl.
           super_TupleElement<0U,_kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>_>
           .value.super_PromiseBase.node.disposer;
      (this->value).ptr.field_1.value.impl.
      super_TupleElement<0U,_kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>_>
      .value.super_PromiseBase.node.ptr = pPVar3;
      (param_1->value).ptr.field_1.value.impl.
      super_TupleElement<0U,_kj::Promise<capnp::Response<capnproto_test::capnp::test::TestPipeline::GetCapResults>_>_>
      .value.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      pPVar1 = (param_1->value).ptr.field_1.value.impl.
               super_TupleElement<1U,_kj::Own<capnp::PipelineHook>_>.value.ptr;
      (this->value).ptr.field_1.value.impl.super_TupleElement<1U,_kj::Own<capnp::PipelineHook>_>.
      value.disposer =
           (param_1->value).ptr.field_1.value.impl.
           super_TupleElement<1U,_kj::Own<capnp::PipelineHook>_>.value.disposer;
      (this->value).ptr.field_1.value.impl.super_TupleElement<1U,_kj::Own<capnp::PipelineHook>_>.
      value.ptr = pPVar1;
      (param_1->value).ptr.field_1.value.impl.super_TupleElement<1U,_kj::Own<capnp::PipelineHook>_>.
      value.ptr = (PipelineHook *)0x0;
      (this->value).ptr.isSet = true;
    }
  }
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;